

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txfm_common_avx2.h
# Opt level: O0

void round_shift_array_32_avx2(__m256i *input,__m256i *output,int size,int bit)

{
  undefined1 auVar1 [32];
  __m256i vec;
  undefined8 *puVar2;
  undefined1 (*pauVar3) [20];
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int i_1;
  int i;
  int local_88;
  int local_84;
  int in_stack_ffffffffffffffb4;
  longlong in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc0 [24];
  
  if (in_ECX < 1) {
    for (local_88 = 0; local_88 < in_EDX; local_88 = local_88 + 1) {
      pauVar3 = (undefined1 (*) [20])(in_RDI + (long)local_88 * 0x20);
      auVar1._20_4_ = (int)((ulong)*(undefined8 *)(*pauVar3 + 0x10) >> 0x20);
      auVar1._0_20_ = *pauVar3;
      auVar1._24_8_ = *(undefined8 *)(pauVar3[1] + 4);
      auVar1 = vpslld_avx2(auVar1,ZEXT416((uint)-in_ECX));
      *(undefined1 (*) [32])(in_RSI + (long)local_88 * 0x20) = auVar1;
    }
  }
  else {
    for (local_84 = 0; local_84 < in_EDX; local_84 = local_84 + 1) {
      puVar2 = (undefined8 *)(in_RDI + (long)local_84 * 0x20);
      uVar4 = *puVar2;
      uVar5 = puVar2[1];
      uVar6 = puVar2[2];
      uVar7 = puVar2[3];
      vec[1] = in_stack_ffffffffffffffc0._0_8_;
      vec[2] = in_stack_ffffffffffffffc0._8_8_;
      vec[3] = in_stack_ffffffffffffffc0._16_8_;
      vec[0] = in_stack_ffffffffffffffb8;
      round_shift_32_avx2(vec,in_stack_ffffffffffffffb4);
      puVar2 = (undefined8 *)(in_RSI + (long)local_84 * 0x20);
      *puVar2 = uVar4;
      puVar2[1] = uVar5;
      puVar2[2] = uVar6;
      puVar2[3] = uVar7;
    }
  }
  return;
}

Assistant:

static inline void round_shift_array_32_avx2(__m256i *input, __m256i *output,
                                             const int size, const int bit) {
  if (bit > 0) {
    int i;
    for (i = 0; i < size; i++) {
      output[i] = round_shift_32_avx2(input[i], bit);
    }
  } else {
    int i;
    for (i = 0; i < size; i++) {
      output[i] = _mm256_slli_epi32(input[i], -bit);
    }
  }
}